

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adlink-ipi.c
# Opt level: O0

void * gpio_interrupt_handler(void *arg)

{
  uint uVar1;
  int iVar2;
  mraa_result_t mVar3;
  int *fds;
  int *piVar4;
  char *pcVar5;
  char local_88 [8];
  char bu [64];
  mraa_gpio_context it;
  int *fps;
  int idx;
  mraa_gpio_context dev;
  mraa_result_t ret;
  void *arg_local;
  
  if (arg == (void *)0x0) {
    syslog(3,"gpio: interrupt_handler: context is invalid");
  }
  else {
    fds = (int *)malloc((ulong)*(uint *)((long)arg + 0x68) << 2);
    if (fds == (int *)0x0) {
      syslog(3,"mraa_gpio_interrupt_handler_multiple() malloc error");
    }
    else {
      snprintf(local_88,0x40,"/sys/class/gpio/gpio%d/value",(ulong)*arg);
      iVar2 = open(local_88,0);
      *fds = iVar2;
      if (-1 < *fds) {
        do {
          do {
            do {
              mVar3 = gpio_wait_interrupt(fds,1,*(mraa_gpio_events_t *)((long)arg + 0x70));
            } while (mVar3 != MRAA_SUCCESS);
          } while (*(int *)((long)arg + 0x2c) != 0);
          pthread_setcancelstate(1,(int *)0x0);
          if (*(long *)((long)arg + 0x10) != 0) {
            (**(code **)((long)arg + 0x10))();
          }
          pthread_setcancelstate(0,(int *)0x0);
        } while( true );
      }
      uVar1 = *arg;
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      syslog(3,"gpio%i: interrupt_handler: failed to open \'value\' : %s",(ulong)uVar1,pcVar5);
      gpio_close_event_handles_sysfs(fds,0);
    }
  }
  return (void *)0x0;
}

Assistant:

static void*
gpio_interrupt_handler(void* arg)
{
	if (arg == NULL) {
		syslog(LOG_ERR, "gpio: interrupt_handler: context is invalid");
		return NULL;
	}

	mraa_result_t ret;
	mraa_gpio_context dev = (mraa_gpio_context) arg;
	int idx = 0;

	int *fps = malloc(dev->num_pins * sizeof(int));
	if (!fps) {
		syslog(LOG_ERR, "mraa_gpio_interrupt_handler_multiple() malloc error");
		return NULL;
	}

	mraa_gpio_context it = dev;

	char bu[MAX_SIZE];
	snprintf(bu, MAX_SIZE, SYSFS_CLASS_GPIO "/gpio%d/value", it->pin);
	fps[idx] = open(bu, O_RDONLY);
	if (fps[idx] < 0) {
		syslog(LOG_ERR, "gpio%i: interrupt_handler: failed to open 'value' : %s", it->pin,
				strerror(errno));
		gpio_close_event_handles_sysfs(fps, idx);
		return NULL;
	}

	idx++;

	for (;;) {
		ret = gpio_wait_interrupt(fps, idx, dev->events);

		if (ret == MRAA_SUCCESS && !dev->isr_thread_terminating) {
			pthread_setcancelstate(PTHREAD_CANCEL_DISABLE, NULL);
			if(dev->isr != NULL)
			{
				(dev->isr)(dev->isr_args);
			}
			pthread_setcancelstate(PTHREAD_CANCEL_ENABLE, NULL);
		}
	}
}